

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_logging.h
# Opt level: O0

void google::
     PrintSequence<__gnu_cxx::_Hashtable_const_iterator<int,int,__gnu_cxx::hash<int>,std::_Identity<int>,std::equal_to<int>,std::allocator<int>>>
               (ostream *out,
               _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
               begin,_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                     end)

{
  bool bVar1;
  reference piVar2;
  int local_34;
  int i;
  ostream *out_local;
  _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
  end_local;
  _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
  begin_local;
  
  end_local._M_cur = (_Node *)end._M_ht;
  out_local = (ostream *)end._M_cur;
  end_local._M_ht = (_Hashtable *)begin._M_cur;
  local_34 = 0;
  while (bVar1 = __gnu_cxx::
                 _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                 ::operator!=((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                               *)&end_local._M_ht,(const_iterator *)&out_local),
        bVar1 && local_34 < 100) {
    if (0 < local_34) {
      std::operator<<(out,' ');
    }
    piVar2 = __gnu_cxx::
             _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
             ::operator*((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)&end_local._M_ht);
    std::ostream::operator<<(out,*piVar2);
    local_34 = local_34 + 1;
    __gnu_cxx::
    _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::operator++((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)&end_local._M_ht);
  }
  bVar1 = __gnu_cxx::
          _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
          ::operator!=((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)&end_local._M_ht,(const_iterator *)&out_local);
  if (bVar1) {
    std::operator<<(out," ...");
  }
  return;
}

Assistant:

inline void PrintSequence(std::ostream& out, Iter begin, Iter end) {
  // Output at most 100 elements -- appropriate if used for logging.
  for (int i = 0; begin != end && i < 100; ++i, ++begin) {
    if (i > 0) out << ' ';
    out << *begin;
  }
  if (begin != end) {
    out << " ...";
  }
}